

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti1_io.c
# Opt level: O3

char * nifti_datatype_string(int dt)

{
  if (dt < 0x100) {
    if (dt < 0x10) {
      switch(dt) {
      case 0:
        return "UNKNOWN";
      case 1:
        return "BINARY";
      case 2:
        return "UINT8";
      case 4:
        return "INT16";
      case 8:
        return "INT32";
      }
    }
    else if (dt < 0x40) {
      if (dt == 0x10) {
        return "FLOAT32";
      }
      if (dt == 0x20) {
        return "COMPLEX64";
      }
    }
    else {
      if (dt == 0x40) {
        return "FLOAT64";
      }
      if (dt == 0x80) {
        return "RGB24";
      }
    }
  }
  else if (dt < 0x500) {
    if (dt < 0x300) {
      if (dt == 0x100) {
        return "INT8";
      }
      if (dt == 0x200) {
        return "UINT16";
      }
    }
    else {
      if (dt == 0x300) {
        return "UINT32";
      }
      if (dt == 0x400) {
        return "INT64";
      }
    }
  }
  else if (dt < 0x700) {
    if (dt == 0x500) {
      return "UINT64";
    }
    if (dt == 0x600) {
      return "FLOAT128";
    }
  }
  else {
    if (dt == 0x700) {
      return "COMPLEX128";
    }
    if (dt == 0x800) {
      return "COMPLEX256";
    }
    if (dt == 0x900) {
      return "RGBA32";
    }
  }
  return "**ILLEGAL**";
}

Assistant:

char const * nifti_datatype_string( int dt )
{
   switch( dt ){
     case DT_UNKNOWN:    return "UNKNOWN"    ;
     case DT_BINARY:     return "BINARY"     ;
     case DT_INT8:       return "INT8"       ;
     case DT_UINT8:      return "UINT8"      ;
     case DT_INT16:      return "INT16"      ;
     case DT_UINT16:     return "UINT16"     ;
     case DT_INT32:      return "INT32"      ;
     case DT_UINT32:     return "UINT32"     ;
     case DT_INT64:      return "INT64"      ;
     case DT_UINT64:     return "UINT64"     ;
     case DT_FLOAT32:    return "FLOAT32"    ;
     case DT_FLOAT64:    return "FLOAT64"    ;
     case DT_FLOAT128:   return "FLOAT128"   ;
     case DT_COMPLEX64:  return "COMPLEX64"  ;
     case DT_COMPLEX128: return "COMPLEX128" ;
     case DT_COMPLEX256: return "COMPLEX256" ;
     case DT_RGB24:      return "RGB24"      ;
     case DT_RGBA32:     return "RGBA32"     ;
   }
   return "**ILLEGAL**" ;
}